

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

bool __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Plus<int,int,int>>
::overlaps<int,false,std::allocator<unsigned_long>>
          (BinaryViewExpressionScalarSecond<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Plus<int,int,int>>
           *this,View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  
  bVar1 = View<int,true,std::allocator<unsigned_long>>::
          overlaps<int,false,std::allocator<unsigned_long>>
                    (*(View<int,true,std::allocator<unsigned_long>> **)this,v);
  return bVar1;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e_.overlaps(v); }